

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O0

bool djgt__push_texture(djg_texture *head,djg_texture *texture,bool flipy)

{
  djg_texture *local_28;
  djg_texture *tail;
  bool flipy_local;
  djg_texture *texture_local;
  djg_texture *head_local;
  
  local_28 = head;
  if (flipy) {
    djgt__flipy(texture);
  }
  for (; local_28->next != (djg_texture *)0x0; local_28 = local_28->next) {
  }
  local_28->next = texture;
  return true;
}

Assistant:

static bool
djgt__push_texture(djg_texture *head, djg_texture *texture, bool flipy)
{
    djg_texture *tail = head;

    if (flipy) djgt__flipy(texture);
    while (tail->next) tail = tail->next;
    tail->next = texture;

    return true;
}